

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUISkin::draw3DMenuPane(CGUISkin *this,IGUIElement *element,rect<int> *r,rect<int> *clip)

{
  IVideoDriver *pIVar1;
  uint uVar2;
  uint uVar3;
  vector2d<int> local_48;
  vector2d<int> vStack_40;
  
  pIVar1 = this->Driver;
  if (pIVar1 != (IVideoDriver *)0x0) {
    local_48 = r->UpperLeftCorner;
    vStack_40 = r->LowerRightCorner;
    if (this->Type == EGST_BURNING_SKIN) {
      local_48.Y = local_48.Y + -3;
      (*(this->super_IGUISkin)._vptr_IGUISkin[0xc])(this,element,&local_48,clip);
    }
    else {
      vStack_40.Y = local_48.Y + 1;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
      vStack_40.Y = (r->LowerRightCorner).Y;
      vStack_40.X = local_48.X + 1;
      pIVar1 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
      local_48.Y = (r->UpperLeftCorner).Y;
      vStack_40 = r->LowerRightCorner;
      local_48.X = vStack_40.X + -1;
      pIVar1 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
      local_48.Y = local_48.Y + 1;
      local_48.X = local_48.X + -1;
      vStack_40.Y = vStack_40.Y + -1;
      vStack_40.X = vStack_40.X + -1;
      pIVar1 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
      local_48.X = (r->UpperLeftCorner).X;
      vStack_40.Y = (r->LowerRightCorner).Y;
      local_48.Y = vStack_40.Y + -1;
      vStack_40.X = (r->LowerRightCorner).X;
      pIVar1 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
      local_48.Y = local_48.Y + -1;
      local_48.X = local_48.X + 1;
      vStack_40.Y = vStack_40.Y + -1;
      vStack_40.X = vStack_40.X + -1;
      pIVar1 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
      local_48.X = (r->UpperLeftCorner).X;
      local_48.Y = (r->UpperLeftCorner).Y;
      vStack_40.X = (r->LowerRightCorner).X;
      vStack_40.Y = (r->LowerRightCorner).Y;
      local_48.Y = local_48.Y + 1;
      local_48.X = local_48.X + 1;
      vStack_40.Y = vStack_40.Y + -2;
      vStack_40.X = vStack_40.X + -2;
      if (this->UseGradient == false) {
        pIVar1 = this->Driver;
        uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
        (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
      }
      else {
        uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
        uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
        (*this->Driver->_vptr_IVideoDriver[0x34])
                  (this->Driver,&local_48,(ulong)uVar2,(ulong)uVar2,(ulong)uVar3,(ulong)uVar3,clip);
      }
    }
  }
  return;
}

Assistant:

void CGUISkin::draw3DMenuPane(IGUIElement *element,
		const core::rect<s32> &r, const core::rect<s32> *clip)
{
	if (!Driver)
		return;

	core::rect<s32> rect = r;

	if (Type == EGST_BURNING_SKIN) {
		rect.UpperLeftCorner.Y -= 3;
		draw3DButtonPaneStandard(element, rect, clip);
		return;
	}

	// in this skin, this is exactly what non pressed buttons look like,
	// so we could simply call
	// draw3DButtonPaneStandard(element, rect, clip);
	// here.
	// but if the skin is transparent, this doesn't look that nice. So
	// We draw it a little bit better, with some more draw2DRectangle calls,
	// but there aren't that much menus visible anyway.

	rect.LowerRightCorner.Y = rect.UpperLeftCorner.Y + 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);

	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = rect.UpperLeftCorner.X + 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);

	rect.UpperLeftCorner.X = r.LowerRightCorner.X - 1;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	rect.UpperLeftCorner.Y = r.UpperLeftCorner.Y;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);

	rect.UpperLeftCorner.X -= 1;
	rect.LowerRightCorner.X -= 1;
	rect.UpperLeftCorner.Y += 1;
	rect.LowerRightCorner.Y -= 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);

	rect.UpperLeftCorner.X = r.UpperLeftCorner.X;
	rect.UpperLeftCorner.Y = r.LowerRightCorner.Y - 1;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);

	rect.UpperLeftCorner.X += 1;
	rect.LowerRightCorner.X -= 1;
	rect.UpperLeftCorner.Y -= 1;
	rect.LowerRightCorner.Y -= 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);

	rect = r;
	rect.UpperLeftCorner.X += 1;
	rect.UpperLeftCorner.Y += 1;
	rect.LowerRightCorner.X -= 2;
	rect.LowerRightCorner.Y -= 2;

	if (!UseGradient)
		Driver->draw2DRectangle(getColor(EGDC_3D_FACE), rect, clip);
	else {
		const video::SColor c1 = getColor(EGDC_3D_FACE);
		const video::SColor c2 = getColor(EGDC_3D_SHADOW);
		Driver->draw2DRectangle(rect, c1, c1, c2, c2, clip);
	}
}